

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_atoi(u_char *line,size_t n)

{
  ngx_int_t cutlim;
  ngx_int_t cutoff;
  ngx_int_t value;
  size_t n_local;
  u_char *line_local;
  
  if (n == 0) {
    line_local = (u_char *)0xffffffffffffffff;
  }
  else {
    cutoff = 0;
    value = n;
    n_local = (size_t)line;
    while (value != 0) {
      if ((*(byte *)n_local < 0x30) || (0x39 < *(byte *)n_local)) {
        return -1;
      }
      if ((0xccccccccccccccb < cutoff) &&
         ((0xccccccccccccccc < cutoff || (7 < (int)(*(byte *)n_local - 0x30))))) {
        return -1;
      }
      cutoff = cutoff * 10 + (long)(int)(*(byte *)n_local - 0x30);
      n_local = n_local + 1;
      value = value + -1;
    }
    line_local = (u_char *)cutoff;
  }
  return (ngx_int_t)line_local;
}

Assistant:

ngx_int_t
ngx_atoi(u_char *line, size_t n)
{
    ngx_int_t  value, cutoff, cutlim;

    if (n == 0) {
        return NGX_ERROR;
    }

    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;

    for (value = 0; n--; line++) {
        if (*line < '0' || *line > '9') {
            return NGX_ERROR;
        }

        if (value >= cutoff && (value > cutoff || *line - '0' > cutlim)) {
            return NGX_ERROR;
        }

        value = value * 10 + (*line - '0');
    }

    return value;
}